

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

int __thiscall CImage::LoadTga(CImage *this,char *szFilename)

{
  unsigned_short uVar1;
  int iVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  byte bVar6;
  uchar uVar7;
  int iVar8;
  FILE *__stream;
  size_t sVar9;
  uchar *puVar10;
  ulong uVar11;
  uchar *puVar12;
  long lVar13;
  ulong __n;
  long lVar14;
  int local_468;
  _TGAHEADER fh;
  uchar BmpPal [256] [4];
  
  __stream = fopen(szFilename,"rb");
  this->f = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    iVar8 = 0x32;
  }
  else {
    sVar9 = fread(&fh,0x12,1,__stream);
    iVar8 = 0x33;
    if (sVar9 == 1) {
      if ((byte)(fh.tiBitPerPixel - 0x21) < 0xe0) {
        iVar8 = 0x34;
      }
      else {
        iVar8 = Init(this,(uint)fh.tiXres,(uint)fh.tiYres,(ushort)fh.tiBitPerPixel);
        if (iVar8 == 0) {
          uVar1 = this->m_BitPerPixel;
          if (uVar1 == 0x20) {
            puVar12 = this->m_pBitmap;
            puVar10 = puVar12 + (long)this->m_NumPixel * 4;
            if ((fh.tiImageType & 8) == 0) {
              iVar8 = -1;
              while (iVar8 = iVar8 + 1, iVar8 < this->m_Yres) {
                puVar10 = puVar10 + (long)this->m_Xres * -4;
                sVar9 = fread(puVar10,4,(long)this->m_Xres,(FILE *)this->f);
                if (sVar9 != (long)this->m_Xres) {
                  return 0x33;
                }
              }
            }
            else {
              puVar10 = puVar10 + (long)this->m_Xres * -4;
              this->m_nCount = 0x8000;
              iVar8 = 0;
              while (puVar12 <= puVar10) {
                bVar6 = Input(this);
                if ((char)bVar6 < '\0') {
                  uVar7 = Input(this);
                  uVar3 = Input(this);
                  uVar4 = Input(this);
                  uVar5 = Input(this);
                  lVar14 = (long)iVar8 * 4;
                  lVar13 = 0;
                  do {
                    if (bVar6 - 0x7f == (int)lVar13) {
                      iVar8 = iVar8 + (int)lVar13;
                      goto LAB_00399410;
                    }
                    puVar10[lVar13 * 4 + lVar14] = uVar7;
                    puVar10[lVar13 * 4 + lVar14 + 1] = uVar3;
                    puVar10[lVar13 * 4 + lVar14 + 2] = uVar4;
                    puVar10[lVar13 * 4 + lVar14 + 3] = uVar5;
                    iVar2 = this->m_Xres;
                    lVar13 = lVar13 + 1;
                  } while (iVar8 + (int)lVar13 != iVar2);
                }
                else {
                  lVar14 = (long)iVar8 * 4;
                  lVar13 = 0;
                  do {
                    if (bVar6 + 1 == (int)lVar13) {
                      iVar8 = iVar8 + (int)lVar13;
                      goto LAB_00399410;
                    }
                    uVar7 = Input(this);
                    uVar3 = Input(this);
                    uVar4 = Input(this);
                    uVar5 = Input(this);
                    puVar10[lVar13 * 4 + lVar14] = uVar7;
                    puVar10[lVar13 * 4 + lVar14 + 1] = uVar3;
                    puVar10[lVar13 * 4 + lVar14 + 2] = uVar4;
                    puVar10[lVar13 * 4 + lVar14 + 3] = uVar5;
                    iVar2 = this->m_Xres;
                    lVar13 = lVar13 + 1;
                  } while (iVar8 + (int)lVar13 != iVar2);
                }
                puVar10 = puVar10 + (long)iVar2 * -4;
                iVar8 = 0;
LAB_00399410:
                puVar12 = this->m_pBitmap;
              }
            }
          }
          else if (uVar1 == 0x18) {
            puVar10 = this->m_pBitmap;
            puVar12 = puVar10 + (long)this->m_NumPixel * 3;
            if ((fh.tiImageType & 8) == 0) {
              iVar8 = -1;
              while (iVar8 = iVar8 + 1, iVar8 < this->m_Yres) {
                puVar12 = puVar12 + (long)this->m_Xres * -3;
                sVar9 = fread(puVar12,3,(long)this->m_Xres,(FILE *)this->f);
                if (sVar9 != (long)this->m_Xres) {
                  return 0x33;
                }
              }
            }
            else {
              puVar12 = puVar12 + (long)this->m_Xres * -3;
              this->m_nCount = 0x8000;
              iVar8 = 0;
              while (puVar10 <= puVar12) {
                bVar6 = Input(this);
                lVar14 = (long)iVar8;
                if ((char)bVar6 < '\0') {
                  uVar7 = Input(this);
                  uVar3 = Input(this);
                  uVar4 = Input(this);
                  lVar13 = 0;
                  do {
                    if ((uint)bVar6 * 3 + -0x17d == (int)lVar13) goto LAB_003992b8;
                    puVar12[lVar13 + lVar14 * 3] = uVar7;
                    puVar12[lVar13 + lVar14 * 3 + 1] = uVar3;
                    puVar12[lVar13 + lVar14 * 3 + 2] = uVar4;
                    iVar2 = this->m_Xres;
                    iVar8 = iVar8 + 1;
                    lVar13 = lVar13 + 3;
                  } while (iVar8 != iVar2);
                }
                else {
                  local_468 = (uint)bVar6 * 3 + 3;
                  lVar13 = 0;
                  do {
                    if (local_468 == (int)lVar13) goto LAB_003992b8;
                    uVar7 = Input(this);
                    uVar3 = Input(this);
                    uVar4 = Input(this);
                    puVar12[lVar13 + lVar14 * 3] = uVar7;
                    puVar12[lVar13 + lVar14 * 3 + 1] = uVar3;
                    puVar12[lVar13 + lVar14 * 3 + 2] = uVar4;
                    iVar2 = this->m_Xres;
                    iVar8 = iVar8 + 1;
                    lVar13 = lVar13 + 3;
                  } while (iVar8 != iVar2);
                }
                puVar12 = puVar12 + (long)iVar2 * -3;
                iVar8 = 0;
LAB_003992b8:
                puVar10 = this->m_pBitmap;
              }
            }
          }
          else {
            if (uVar1 != 8) {
              return 0x36;
            }
            if (fh.tiPaletteIncluded == '\x01') {
              if (fh.tiPaletteBpp == ' ') {
                __n = (ulong)fh.tiPaletteSize;
                sVar9 = fread(BmpPal,4,__n,(FILE *)this->f);
                if (sVar9 != __n) {
                  return 0x33;
                }
                puVar10 = &this->m_Pal[0].r;
                for (uVar11 = 0; __n != uVar11; uVar11 = uVar11 + 1) {
                  ((_BGR *)(puVar10 + -2))->b = BmpPal[uVar11][0];
                  puVar10[-1] = BmpPal[uVar11][1];
                  *puVar10 = BmpPal[uVar11][2];
                  puVar10 = puVar10 + 3;
                }
              }
              else if ((fh.tiPaletteBpp == '\x18') &&
                      (sVar9 = fread(this->m_Pal,3,(ulong)fh.tiPaletteSize,(FILE *)this->f),
                      sVar9 != fh.tiPaletteSize)) {
                return 0x33;
              }
            }
            else {
              puVar10 = &this->m_Pal[0].r;
              for (lVar14 = 0; lVar14 != 0x100; lVar14 = lVar14 + 1) {
                uVar7 = (uchar)lVar14;
                *puVar10 = uVar7;
                puVar10[-1] = uVar7;
                ((_BGR *)(puVar10 + -2))->b = uVar7;
                puVar10 = puVar10 + 3;
              }
            }
            puVar10 = this->m_pBitmap;
            puVar12 = puVar10 + this->m_NumPixel;
            if ((fh.tiImageType & 8) == 0) {
              iVar8 = -1;
              while (iVar8 = iVar8 + 1, iVar8 < this->m_Yres) {
                puVar12 = puVar12 + -(long)this->m_Xres;
                sVar9 = fread(puVar12,1,(long)this->m_Xres,(FILE *)this->f);
                if (sVar9 != (long)this->m_Xres) {
                  return 0x33;
                }
              }
            }
            else {
              puVar12 = puVar12 + -(long)this->m_Xres;
              this->m_nCount = 0x8000;
              iVar8 = 0;
              while (puVar10 <= puVar12) {
                bVar6 = Input(this);
                if ((char)bVar6 < '\0') {
                  uVar7 = Input(this);
                  lVar14 = 0;
                  do {
                    if (bVar6 - 0x7f == (int)lVar14) {
                      iVar8 = iVar8 + (int)lVar14;
                      goto LAB_003994df;
                    }
                    puVar12[lVar14 + iVar8] = uVar7;
                    iVar2 = this->m_Xres;
                    lVar14 = lVar14 + 1;
                  } while ((int)lVar14 + iVar8 != iVar2);
                }
                else {
                  lVar14 = 0;
                  do {
                    if (bVar6 + 1 == (int)lVar14) {
                      iVar8 = iVar8 + (int)lVar14;
                      goto LAB_003994df;
                    }
                    uVar7 = Input(this);
                    puVar12[lVar14 + iVar8] = uVar7;
                    iVar2 = this->m_Xres;
                    lVar14 = lVar14 + 1;
                  } while ((int)lVar14 + iVar8 != iVar2);
                }
                puVar12 = puVar12 + -(long)iVar2;
                iVar8 = 0;
LAB_003994df:
                puVar10 = this->m_pBitmap;
              }
            }
          }
          fclose((FILE *)this->f);
          iVar8 = 0;
        }
        else {
          iVar8 = 0x35;
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int CImage::LoadTga(char *szFilename)
{
  _TGAHEADER      fh;
  int             i, j, k;
  unsigned char   nCount;

  if (!(f = fopen(szFilename, "rb"))) return eLoadTgaFileOpen;
  if (fread(&fh, sizeof(fh), 1, f) != 1) return eLoadTgaFileRead;
  bool bCompressed = (( fh.tiImageType & 8 ) != 0);
  if ((fh.tiBitPerPixel<=0) || (fh.tiBitPerPixel>32))
    return eLoadTgaBadFormat;

  if ( Init( fh.tiXres, fh.tiYres, fh.tiBitPerPixel ) != 0 ) 
    return eLoadTgaInit;

  if ( m_BitPerPixel == 8 )
  {
    if ( fh.tiPaletteIncluded == 1 )
    {
      if ( fh.tiPaletteBpp == 24)
      {
        if (fread(&m_Pal, 3, fh.tiPaletteSize, f) != fh.tiPaletteSize) 
          return eLoadTgaFileRead;
      }
      else
      if ( fh.tiPaletteBpp == 32)
      {
        unsigned char BmpPal[256][4];

        if (fread(&BmpPal, 4, fh.tiPaletteSize, f) != fh.tiPaletteSize) 
          return eLoadTgaFileRead;

        for (i=0; i<fh.tiPaletteSize; i++)
        {
          m_Pal[i].b = BmpPal[i][0];
          m_Pal[i].g = BmpPal[i][1];
          m_Pal[i].r = BmpPal[i][2];
        }
      }
    }
    else
    {
      for (i=0; i<256; i++)
      {
        m_Pal[i].r = i;
        m_Pal[i].g = i;
        m_Pal[i].b = i;
      }
    }

    unsigned char * pcolBuf = m_pBitmap;
    pcolBuf += m_NumPixel;

    if ( !bCompressed )
    {
      for (j=0; j<m_Yres; j++)
      {
        pcolBuf -= m_Xres;
        if (fread(pcolBuf, 1, m_Xres, f) != (size_t)m_Xres) 
          return eLoadTgaFileRead;
      }
    }
    else
    {
      unsigned char colCur;

      pcolBuf -= m_Xres;

      i = 0;
      m_nCount = sizeof(m_cBuf);

      while ( pcolBuf >= m_pBitmap )
      {
        nCount = Input();
        if ((nCount & 128)==0)
        {
          for (k=0; k<=nCount; k++)
          {
            colCur = Input();
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
        else
        {
          colCur = Input();
          for (k=0; k<=nCount-128; k++)
          {
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
      }
    }
  }
  else
  if ( m_BitPerPixel == 24 )
  {
    _BGR * pcolBuf = (_BGR *)m_pBitmap;
    pcolBuf += m_NumPixel;

    if ( !bCompressed )
    {
      for (j=0; j<m_Yres; j++)
      {
        pcolBuf -= m_Xres;
        if (fread(pcolBuf, sizeof(_BGR), m_Xres, f) != (size_t)m_Xres) 
          return eLoadTgaFileRead;
      }
    }
    else
    {
      _BGR colCur;

      pcolBuf -= m_Xres;

      i = 0;
      m_nCount = sizeof(m_cBuf);

      while ( pcolBuf >= (_BGR *)m_pBitmap )
      {
        nCount = Input();
        if ((nCount & 128)==0)
        {
          for (k=0; k<=nCount; k++)
          {
            colCur.b = Input();
            colCur.g = Input();
            colCur.r = Input();
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
        else
        {
          colCur.b = Input();
          colCur.g = Input();
          colCur.r = Input();
          for (k=0; k<=nCount-128; k++)
          {
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
      }
    }
  }
  else
  if ( m_BitPerPixel == 32 )
  {
    _BGRA * pcolBuf = (_BGRA *)m_pBitmap;
    pcolBuf += m_NumPixel;

    if ( !bCompressed )
    {
      for (j=0; j<m_Yres; j++)
      {
        pcolBuf -= m_Xres;
        if (fread(pcolBuf, sizeof(_BGRA), m_Xres, f) != (size_t)m_Xres) 
          return eLoadTgaFileRead;
      }
    }
    else
    {
      _BGRA colCur;

      pcolBuf -= m_Xres;

      i = 0;
      m_nCount = sizeof(m_cBuf);

      while ( pcolBuf >= (_BGRA *)m_pBitmap )
      {
        nCount = Input();
        if ((nCount & 128)==0)
        {
          for (k=0; k<=nCount; k++)
          {
            colCur.b = Input();
            colCur.g = Input();
            colCur.r = Input();
            colCur.a = Input();
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
        else
        {
          colCur.b = Input();
          colCur.g = Input();
          colCur.r = Input();
          colCur.a = Input();
          for (k=0; k<=nCount-128; k++)
          {
            *(pcolBuf+i) = colCur;
            if ( (++i) == m_Xres )
            {
              i=0;
              pcolBuf -= m_Xres;
              break;
            }
          }
        }
      }
    }
  }
  else 
    return eLoadTgaColorDepth;

  fclose(f);

  return 0;
}